

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::test_string_allocator(void)

{
  bool bVar1;
  char input [8];
  reader reader;
  uint local_194;
  return_type local_190;
  char local_168 [8];
  basic_reader<char> local_160;
  
  builtin_strncpy(local_168,"\"alpha\"",8);
  local_190._M_dataplus._0_8_ = strlen(local_168);
  local_190._M_dataplus._M_p = local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_160,(view_type *)&local_190);
  local_194 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbc,"void basic_suite::test_string_allocator()",&local_190,&local_194);
  local_190._M_dataplus._0_4_ =
       trial::protocol::json::token::symbol::convert(local_160.decoder.current.code);
  local_194 = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbd,"void basic_suite::test_string_allocator()",&local_190,&local_194);
  local_190._M_dataplus._0_4_ = trial::protocol::json::basic_reader<char>::category(&local_160);
  local_194 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbe,"void basic_suite::test_string_allocator()",&local_190,&local_194);
  trial::protocol::json::basic_reader<char>::
  overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::scoped_allocator_adaptor<std::allocator<char>_>_>,_void>
  ::value(&local_190,&local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::__cxx11::basic_string<char,std::char_traits<char>,std::scoped_allocator_adaptor<std::allocator<char>>>,char[6]>
            ("reader.value<string_type>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc0,"void basic_suite::test_string_allocator()",&local_190,"alpha");
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_std::scoped_allocator_adaptor<std::allocator<char>_>_>
  ::~basic_string(&local_190);
  local_190._M_dataplus._0_8_ =
       (long)local_160.decoder.current.view.tail - (long)local_160.decoder.current.view.head;
  local_190._M_dataplus._M_p = local_160.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.literal()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc1,"void basic_suite::test_string_allocator()",&local_190,"\"alpha\"");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
  local_190._M_dataplus._0_1_ = bVar1;
  local_194 = local_194 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc2,"void basic_suite::test_string_allocator()",&local_190,&local_194);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_160.stack);
  return;
}

Assistant:

void test_string_allocator()
{
    const char input[] = "\"alpha\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    using string_type = std::basic_string<char, std::char_traits<char>, std::scoped_allocator_adaptor<std::allocator<char>>>;
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<string_type>(), "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"alpha\"");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}